

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall CcsTest_DomainBuilder_Test::TestBody(CcsTest_DomainBuilder_Test *this)

{
  string *psVar1;
  AssertionResult *__writefds;
  fd_set *in_R8;
  char *pcVar2;
  timeval *in_R9;
  allocator local_29d;
  allocator local_29c;
  allocator local_29b;
  allocator local_29a;
  allocator local_299;
  allocator local_298;
  allocator local_297;
  allocator local_296;
  allocator local_295;
  allocator local_294;
  allocator local_293;
  allocator local_292;
  allocator local_291;
  string local_290;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  CcsDomain ccs;
  string local_228;
  AssertionResult gtest_ar_1;
  CcsContext ctx;
  undefined1 local_1c8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  RuleBuilder local_198;
  undefined1 local_188 [32];
  RuleBuilder local_168;
  undefined1 local_158 [32];
  RuleBuilder local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  undefined1 local_d8 [64];
  string local_98;
  string local_78 [32];
  string local_58;
  string local_38;
  RuleBuilder local_18;
  
  ::ccs::CcsDomain::CcsDomain(&ccs,false);
  ::ccs::CcsDomain::ruleBuilder((CcsDomain *)(local_1c8 + 0x20));
  std::__cxx11::string::string((string *)&local_290,"a",&local_291);
  std::__cxx11::string::string((string *)&gtest_ar,"base",&local_292);
  ::ccs::RuleBuilder::set(&local_198,(string *)(local_1c8 + 0x20),&local_290);
  std::__cxx11::string::string((string *)&gtest_ar_2,"a",&local_293);
  std::__cxx11::string::string((string *)&local_228,"b",&local_294);
  anon_unknown.dwarf_2c58d::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f0,&local_228);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)local_188,(int)&local_198,(fd_set *)&gtest_ar_2,(fd_set *)local_f0,in_R8
             ,in_R9);
  std::__cxx11::string::string((string *)&ctx,"a",&local_295);
  std::__cxx11::string::string((string *)&gtest_ar_1,"123",&local_296);
  __writefds = &gtest_ar_1;
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_188 + 0x10),(string *)local_188,(string *)&ctx);
  ::ccs::RuleBuilder::pop(&local_168);
  std::__cxx11::string::string((string *)local_1c8,"c",&local_297);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)local_158,(int)&local_168,(fd_set *)local_1c8,(fd_set *)__writefds,in_R8
             ,in_R9);
  std::__cxx11::string::string((string *)&local_98,"b",&local_298);
  std::__cxx11::string::string((string *)(local_d8 + 0x20),"true",&local_299);
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_158 + 0x10),(string *)local_158,&local_98);
  ::ccs::RuleBuilder::pop(&local_138);
  std::__cxx11::string::string((string *)local_d8,"c",&local_29a);
  std::__cxx11::string::string((string *)&local_38,"d",&local_29b);
  anon_unknown.dwarf_2c58d::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108,&local_38);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)local_128,(int)&local_138,(fd_set *)local_d8,(fd_set *)local_108,in_R8,
             in_R9);
  std::__cxx11::string::string((string *)&local_58,"b",&local_29c);
  std::__cxx11::string::string(local_78,"false",&local_29d);
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_128 + 0x10),(string *)local_128,&local_58);
  ::ccs::RuleBuilder::pop(&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 0x18));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_108);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 0x18));
  std::__cxx11::string::~string((string *)(local_d8 + 0x20));
  std::__cxx11::string::~string((string *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
  std::__cxx11::string::~string((string *)local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 0x18));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&ctx);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f0);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_290);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  ::ccs::CcsDomain::build((CcsDomain *)&ctx);
  std::__cxx11::string::string((string *)&local_290,"a",(allocator *)&gtest_ar_2);
  psVar1 = ::ccs::CcsContext::getString(&ctx,&local_290);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"base\"","ctx.getString(\"a\")",(char (*) [5])"base",psVar1);
  std::__cxx11::string::~string((string *)&local_290);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_290);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if ((long *)local_290._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_290._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_290,"a",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&gtest_ar,"b",(allocator *)(local_d8 + 0x20));
  anon_unknown.dwarf_2c58d::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_228,(string *)&gtest_ar);
  ::ccs::CcsContext::CcsContext
            ((CcsContext *)local_1c8,&ctx,&local_290,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_228);
  std::__cxx11::string::string((string *)&gtest_ar_2,"a",(allocator *)local_d8);
  psVar1 = ::ccs::CcsContext::getString((CcsContext *)local_1c8,(string *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"123\"","ctx.constrain(\"a\", v(\"b\")).getString(\"a\")",
             (char (*) [4])0x16478e,psVar1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_228);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_290);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_290);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)local_290._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_290._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&local_290,"c",(allocator *)&gtest_ar_1);
  ::ccs::CcsContext::CcsContext((CcsContext *)&local_228,&ctx,&local_290);
  std::__cxx11::string::string((string *)&gtest_ar,"a",(allocator *)local_1c8);
  psVar1 = ::ccs::CcsContext::getString((CcsContext *)&local_228,(string *)&gtest_ar);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"base\"","ctx.constrain(\"c\").getString(\"a\")",
             (char (*) [5])"base",psVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
  std::__cxx11::string::~string((string *)&local_290);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_290);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)local_290._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_290._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::ccs::CcsDomain::~CcsDomain(&ccs);
  return;
}

Assistant:

TEST(CcsTest, DomainBuilder) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("a", "base")
      .select("a", v("b")).set("a", "123").pop()
      .select("c").set("b", "true").pop()
      .select("c", v("d")).set("b", "false").pop();
  CcsContext ctx = ccs.build();
  EXPECT_EQ("base", ctx.getString("a"));
  EXPECT_EQ("123", ctx.constrain("a", v("b")).getString("a"));
  EXPECT_EQ("base", ctx.constrain("c").getString("a"));
}